

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::matchesFilters
               (vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *filters,
               TestCase *testCase)

{
  bool bVar1;
  pointer this;
  __normal_iterator<const_Catch::TestCaseFilters_*,_std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>_>
  local_30;
  const_iterator itEnd;
  const_iterator it;
  TestCase *testCase_local;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *filters_local;
  
  itEnd = std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::begin
                    (filters);
  local_30._M_current =
       (TestCaseFilters *)
       std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::end(filters);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&itEnd,&local_30);
    if (!bVar1) {
      return true;
    }
    this = __gnu_cxx::
           __normal_iterator<const_Catch::TestCaseFilters_*,_std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>_>
           ::operator->(&itEnd);
    bVar1 = TestCaseFilters::shouldInclude(this,testCase);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCaseFilters_*,_std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>_>
    ::operator++(&itEnd);
  }
  return false;
}

Assistant:

inline bool matchesFilters( std::vector<TestCaseFilters> const& filters, TestCase const& testCase ) {
        std::vector<TestCaseFilters>::const_iterator it = filters.begin();
        std::vector<TestCaseFilters>::const_iterator itEnd = filters.end();
        for(; it != itEnd; ++it )
            if( !it->shouldInclude( testCase ) )
                return false;
        return true;
    }